

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.h
# Opt level: O1

char * __thiscall cppcms::impl::cgi::connection::getenv_abi_cxx11_(connection *this,char *__name)

{
  char *__s;
  char *pcVar1;
  int iVar2;
  long lVar3;
  mapped_type *pmVar4;
  allocator local_51;
  key_type local_50;
  
  if (*(long *)(this + 0xe8) == 0) {
    iVar2 = *(int *)(this + 0x38);
    while (iVar2 != -1) {
      lVar3 = (long)iVar2;
      __s = *(char **)(*(long *)(this + 0x48) + 8 + lVar3 * 0x18);
      std::__cxx11::string::string
                ((string *)&local_50,*(char **)(*(long *)(this + 0x48) + lVar3 * 0x18),&local_51);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(this + 0xc0),&local_50);
      pcVar1 = (char *)pmVar4->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar1,(ulong)__s);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      iVar2 = *(int *)(*(long *)(this + 0x48) + 0x14 + lVar3 * 0x18);
    }
  }
  return (char *)(this + 0xc0);
}

Assistant:

virtual std::map<std::string,std::string> const &getenv()
		{
			if(map_env_.empty() && env_.begin()!=env_.end()) {
				for(string_map::iterator p=env_.begin();p!=env_.end();++p) {
					map_env_[p->key]=p->value;
				}
			}
			return map_env_;
		}